

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O0

CBlock * __thiscall
TestChain100Setup::CreateAndProcessBlock
          (TestChain100Setup *this,
          vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *txns,
          CScript *scriptPubKey,Chainstate *chainstate)

{
  long lVar1;
  char *in_RSI;
  CBlock *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  Chainstate *in_stack_00000010;
  CScript *in_stack_00000018;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *in_stack_00000020;
  TestChain100Setup *in_stack_00000028;
  CBlock *block;
  shared_ptr<const_CBlock> shared_pblock;
  CBlock *in_stack_ffffffffffffff78;
  ChainstateManager *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined1 uVar2;
  byte bVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_R8 == 0) {
    inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_RSI,(char *)in_RDI);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_ffffffffffffff78);
    ChainstateManager::ActiveChainstate(in_stack_ffffffffffffff88);
  }
  uVar2 = 0;
  CreateBlock(in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  std::make_shared<CBlock_const,CBlock&>
            ((CBlock *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             CONCAT17(uVar2,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffac,in_RSI,(char *)in_RDI);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffff78);
  ChainstateManager::ProcessNewBlock
            ((ChainstateManager *)block,(shared_ptr<const_CBlock> *)this,txns._7_1_,txns._6_1_,
             (bool *)scriptPubKey);
  bVar3 = 1;
  std::shared_ptr<const_CBlock>::~shared_ptr((shared_ptr<const_CBlock> *)in_stack_ffffffffffffff78);
  if ((bVar3 & 1) == 0) {
    CBlock::~CBlock(in_stack_ffffffffffffff78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CBlock TestChain100Setup::CreateAndProcessBlock(
    const std::vector<CMutableTransaction>& txns,
    const CScript& scriptPubKey,
    Chainstate* chainstate)
{
    if (!chainstate) {
        chainstate = &Assert(m_node.chainman)->ActiveChainstate();
    }

    CBlock block = this->CreateBlock(txns, scriptPubKey, *chainstate);
    std::shared_ptr<const CBlock> shared_pblock = std::make_shared<const CBlock>(block);
    Assert(m_node.chainman)->ProcessNewBlock(shared_pblock, true, true, nullptr);

    return block;
}